

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O2

void __thiscall TApp_IniFailure_Test::TestBody(TApp_IniFailure_Test *this)

{
  bool bVar1;
  ostream *poVar2;
  AssertHelper AStack_2b8;
  TempFile tmpini;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  ofstream out;
  
  std::__cxx11::string::string((string *)&local_230,"TestIniTmp.ini",(allocator *)&out);
  TempFile::TempFile(&tmpini,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_250,"--config",(allocator *)&out);
  std::__cxx11::string::string((string *)&local_270,(string *)&tmpini);
  std::__cxx11::string::string((string *)&local_290,"Read an ini file",(allocator *)&AStack_2b8);
  CLI::App::set_config(&(this->super_TApp).app,&local_250,&local_270,&local_290,false);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::ofstream::ofstream(&out,(string *)&tmpini,_S_out);
  poVar2 = std::operator<<((ostream *)&out,"[default]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&out,"val=1");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ofstream::~ofstream(&out);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)&out);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
             ,0x17b,
             "Expected: run() throws an exception of type CLI::INIError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_2b8,(Message *)&out);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&out);
  TempFile::~TempFile(&tmpini);
  return;
}

Assistant:

TEST_F(TApp, IniFailure) {

    TempFile tmpini{"TestIniTmp.ini"};

    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "[default]" << std::endl;
        out << "val=1" << std::endl;
    }

    EXPECT_THROW(run(), CLI::INIError);
}